

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O0

int pybind11::detail::
    process_attributes<pybind11::is_method,_pybind11::return_value_policy,_char[39]>::init
              (EVP_PKEY_CTX *ctx)

{
  int iVar1;
  EVP_PKEY_CTX *in_RCX;
  process_attribute<const_char_*,_void> *in_RDX;
  process_attribute<pybind11::return_value_policy,_void> *in_RSI;
  function_record *r_local;
  char (*args_local_2) [39];
  return_value_policy *args_local_1;
  is_method *args_local;
  
  process_attribute<pybind11::is_method,_void>::init
            ((process_attribute<pybind11::is_method,_void> *)ctx,in_RCX);
  process_attribute<pybind11::return_value_policy,_void>::init(in_RSI,in_RCX);
  iVar1 = process_attribute<const_char_*,_void>::init(in_RDX,in_RCX);
  return iVar1;
}

Assistant:

static void init(const Args &...args, function_record *r) {
        PYBIND11_WORKAROUND_INCORRECT_MSVC_C4100(r);
        PYBIND11_WORKAROUND_INCORRECT_GCC_UNUSED_BUT_SET_PARAMETER(r);
        using expander = int[];
        (void) expander{
            0, ((void) process_attribute<typename std::decay<Args>::type>::init(args, r), 0)...};
    }